

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::setPlotVariables(PeleLM *this)

{
  ostringstream *poVar1;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  undefined1 local_1b8 [24];
  undefined8 auStack_1a0 [46];
  
  amrex::AmrLevel::setPlotVariables((AmrLevel *)this);
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
            ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1d8);
  if (local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start &&
      -1 < (long)local_1d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_1d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      std::operator+(&local_1f8,"rho.Y(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((local_1d8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5
                     ));
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar3) {
        local_1b8._16_8_ = *psVar3;
        auStack_1a0[0] = plVar2[3];
        local_1b8._0_8_ = local_1b8 + 0x10;
      }
      else {
        local_1b8._16_8_ = *psVar3;
        local_1b8._0_8_ = (size_type *)*plVar2;
      }
      local_1b8._8_8_ = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
          &local_1f8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),
                        local_1f8.field_2._M_allocated_capacity + 1);
      }
      amrex::Amr::deleteStatePlotVar((string *)local_1b8);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar4 < (long)local_1d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_1d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
  }
  if (NavierStokesBase::verbose != 0) {
    local_1b8._8_8_ = amrex::OutStream();
    local_1b8._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
    local_1b8._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
    *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
         *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"\nState Plot Vars: ",0x12);
    amrex::Print::~Print((Print *)local_1b8);
    if ((undefined8 **)amrex::Amr::state_plot_vars_abi_cxx11_ !=
        &amrex::Amr::state_plot_vars_abi_cxx11_) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      puVar6 = amrex::Amr::state_plot_vars_abi_cxx11_;
      do {
        local_1b8._8_8_ = amrex::OutStream();
        local_1b8._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
        local_1b8._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
             *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)puVar6[2],puVar6[3]);
        local_1f8._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1f8,1);
        amrex::Print::~Print((Print *)local_1b8);
        puVar6 = (undefined8 *)*puVar6;
      } while ((undefined8 **)puVar6 != &amrex::Amr::state_plot_vars_abi_cxx11_);
    }
    local_1b8._8_8_ = amrex::OutStream();
    local_1b8._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
    local_1b8._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
    *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
         *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),(char *)&local_1f8,1);
    amrex::Print::~Print((Print *)local_1b8);
    local_1b8._8_8_ = amrex::OutStream();
    local_1b8._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
    local_1b8._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
    *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
         *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"\nDerive Plot Vars: ",0x13);
    amrex::Print::~Print((Print *)local_1b8);
    if ((undefined8 **)amrex::Amr::derive_plot_vars_abi_cxx11_ !=
        &amrex::Amr::derive_plot_vars_abi_cxx11_) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      puVar6 = amrex::Amr::derive_plot_vars_abi_cxx11_;
      do {
        local_1b8._8_8_ = amrex::OutStream();
        local_1b8._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
        local_1b8._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
             *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)puVar6[2],puVar6[3]);
        local_1f8._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1f8,1);
        amrex::Print::~Print((Print *)local_1b8);
        puVar6 = (undefined8 *)*puVar6;
      } while ((undefined8 **)puVar6 != &amrex::Amr::derive_plot_vars_abi_cxx11_);
    }
    local_1b8._8_8_ = amrex::OutStream();
    local_1b8._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
    local_1b8._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
    *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
         *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
    local_1f8._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),(char *)&local_1f8,1);
    amrex::Print::~Print((Print *)local_1b8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  return;
}

Assistant:

void
PeleLM::setPlotVariables ()
{
  AmrLevel::setPlotVariables();

  Vector<std::string> names;
  pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);


// Here we specify to not plot all the rho.Y from the state variables
// because it takes a lot of space in memory and disk usage
// To plot rho.Y, we pass into a derive function (see PeleLM_setup.cpp)
// and it can be activated with "amr.derive_plot_vars=rhoY" in the input file
  for (long int i = 0; i < names.size(); i++)
  {
    const std::string name = "rho.Y("+names[i]+")";
    parent->deleteStatePlotVar(name);
  }

  if (verbose)
  {
    amrex::Print() << "\nState Plot Vars: ";

    std::list<std::string>::const_iterator li =
      parent->statePlotVars().begin(), end = parent->statePlotVars().end();

    for ( ; li != end; ++li)
      amrex::Print() << *li << ' ';
    amrex::Print() << '\n';

    amrex::Print() << "\nDerive Plot Vars: ";

    li  = parent->derivePlotVars().begin();
    end = parent->derivePlotVars().end();

    for ( ; li != end; ++li)
      amrex::Print() << *li << ' ';
    amrex::Print() << '\n';
  }
}